

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O3

void __thiscall EditDistance::updateDpPosition(EditDistance *this,int i,int j,int d)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  IntVar *pIVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  IntView<0> *jVar;
  int iVar9;
  IntView<0> *iVar;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (j == 0 && i == 0) {
    return;
  }
  uVar4 = j - 1;
  jVar = this->seq2 + (long)j + -1;
  if (i == 0) {
    pIVar5 = jVar->var;
    uVar1 = (pIVar5->min).v;
    if ((int)uVar1 < 1) {
      iVar9 = 0;
    }
    else {
      piVar8 = (this->insertion_cost).data;
      uVar2 = (pIVar5->max).v;
      uVar10 = (ulong)uVar1;
      iVar9 = piVar8[uVar10 - 1];
      if (uVar1 != uVar2) {
        do {
          iVar11 = uVar2 - (int)uVar10;
          do {
            iVar11 = iVar11 + -1;
            lVar6 = uVar10 + 1;
            uVar10 = uVar10 + 1;
          } while (pIVar5->vals[lVar6].v == '\0');
          uVar10 = uVar10 & 0xffffffff;
          iVar12 = piVar8[uVar10 - 1];
          if (iVar12 < iVar9) {
            iVar9 = iVar12;
          }
        } while (iVar11 != 0);
      }
    }
    piVar8 = (this->dpMatrix).data;
    iVar9 = iVar9 + piVar8[uVar4];
    goto LAB_0016c76c;
  }
  iVar11 = i + -1;
  iVar = this->seq1 + (long)i + -1;
  if (j == 0) {
    pIVar5 = iVar->var;
    uVar4 = (pIVar5->min).v;
    if ((int)uVar4 < 1) {
      iVar9 = 0;
    }
    else {
      piVar8 = (this->deletion_cost).data;
      uVar1 = (pIVar5->max).v;
      uVar10 = (ulong)uVar4;
      iVar9 = piVar8[uVar10 - 1];
      if (uVar4 != uVar1) {
        do {
          iVar12 = uVar1 - (int)uVar10;
          do {
            iVar12 = iVar12 + -1;
            lVar6 = uVar10 + 1;
            uVar10 = uVar10 + 1;
          } while (pIVar5->vals[lVar6].v == '\0');
          uVar10 = uVar10 & 0xffffffff;
          iVar7 = piVar8[uVar10 - 1];
          if (iVar7 < iVar9) {
            iVar9 = iVar7;
          }
        } while (iVar12 != 0);
      }
    }
    iVar12 = this->seqSize + 1;
    piVar8 = (this->dpMatrix).data;
    iVar9 = iVar9 + piVar8[(uint)(iVar11 * iVar12)];
    j = iVar12 * i;
    goto LAB_0016c76c;
  }
  iVar12 = this->seqSize;
  iVar9 = this->max_id_cost * iVar12 * 2;
  if (i - d < j) {
    pIVar5 = jVar->var;
    uVar1 = (pIVar5->min).v;
    if ((int)uVar1 < 1) {
      iVar7 = 0;
    }
    else {
      piVar8 = (this->insertion_cost).data;
      uVar2 = (pIVar5->max).v;
      uVar10 = (ulong)uVar1;
      iVar7 = piVar8[uVar10 - 1];
      if (uVar1 != uVar2) {
        do {
          iVar13 = uVar2 - (int)uVar10;
          do {
            iVar13 = iVar13 + -1;
            lVar6 = uVar10 + 1;
            uVar10 = uVar10 + 1;
          } while (pIVar5->vals[lVar6].v == '\0');
          uVar10 = uVar10 & 0xffffffff;
          iVar3 = piVar8[uVar10 - 1];
          if (iVar3 < iVar7) {
            iVar7 = iVar3;
          }
        } while (iVar13 != 0);
      }
    }
    iVar7 = iVar7 + (this->dpMatrix).data[(iVar12 + 1) * i + uVar4];
    if (iVar7 < iVar9) {
      iVar9 = iVar7;
    }
  }
  pIVar5 = iVar->var;
  uVar1 = (pIVar5->min).v;
  if (j < d + i) {
    if ((int)uVar1 < 1) {
      iVar7 = 0;
    }
    else {
      piVar8 = (this->deletion_cost).data;
      uVar2 = (pIVar5->max).v;
      uVar10 = (ulong)uVar1;
      iVar7 = piVar8[uVar10 - 1];
      if (uVar1 != uVar2) {
        do {
          iVar13 = uVar2 - (int)uVar10;
          do {
            iVar13 = iVar13 + -1;
            lVar6 = uVar10 + 1;
            uVar10 = uVar10 + 1;
          } while (pIVar5->vals[lVar6].v == '\0');
          uVar10 = uVar10 & 0xffffffff;
          iVar3 = piVar8[uVar10 - 1];
          if (iVar3 < iVar7) {
            iVar7 = iVar3;
          }
        } while (iVar13 != 0);
      }
    }
    iVar7 = iVar7 + (this->dpMatrix).data[(uint)((iVar12 + 1) * iVar11 + j)];
    if (iVar7 < iVar9) {
      iVar9 = iVar7;
    }
  }
  if (uVar1 == (pIVar5->max).v) {
    uVar2 = (jVar->var->min).v;
    if ((uVar1 != uVar2) || (uVar2 != (jVar->var->max).v)) goto LAB_0016c73e;
    iVar12 = iVar12 + 1;
    piVar8 = (this->dpMatrix).data;
    iVar7 = piVar8[iVar11 * iVar12 + uVar4];
  }
  else {
LAB_0016c73e:
    iVar7 = getMinimumSubstitutionCost(this,iVar,jVar);
    iVar12 = this->seqSize + 1;
    piVar8 = (this->dpMatrix).data;
    iVar7 = iVar7 + piVar8[iVar11 * iVar12 + uVar4];
  }
  if (iVar7 < iVar9) {
    iVar9 = iVar7;
  }
  j = iVar12 * i + j;
LAB_0016c76c:
  piVar8[(uint)j] = iVar9;
  return;
}

Assistant:

void updateDpPosition(int i, int j, int d) {
		IntView<>* const iVar = &seq1[i - 1];
		IntView<>* const jVar = &seq2[j - 1];

		if (i == 0 && j == 0) {
			// top left position is always 0
		} else if (i == 0) {
			const int min_insertion_costs = getMinimumInsertionCosts(jVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(0, j - 1)] + min_insertion_costs;
		} else if (j == 0) {
			const int min_deletion_costs = getMinimumDeletionCosts(iVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(i - 1, 0)] + min_deletion_costs;
		} else {
			int minChange = seqSize * 2 * max_id_cost;

			if (j - 1 >= i - d) {
				const int min_insertion_costs = getMinimumInsertionCosts(jVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i, j - 1)] + min_insertion_costs);
			}
			if (j < i + d) {
				const int min_deletion_costs = getMinimumDeletionCosts(iVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j)] + min_deletion_costs);
			}

			if (iVar->isFixed() && jVar->isFixed() && iVar->getVal() == jVar->getVal()) {
				// both values fixed and equal
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j - 1)]);
			} else {
				const int minDiagonalCost = getMinimumSubstitutionCost(iVar, jVar);
				const int diagonalCost = dpMatrix[matrixCoord(i - 1, j - 1)] + minDiagonalCost;
				minChange = std::min(minChange, diagonalCost);
			}
			dpMatrix[matrixCoord(i, j)] = minChange;
		}
	}